

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool gl4cts::Utils::isScalarVariableType(_variable_type type)

{
  bool local_d;
  bool result;
  _variable_type type_local;
  
  local_d = false;
  switch(type) {
  case VARIABLE_TYPE_BOOL:
    local_d = true;
    break;
  default:
    break;
  case VARIABLE_TYPE_DOUBLE:
    local_d = true;
    break;
  case VARIABLE_TYPE_FLOAT:
    local_d = true;
    break;
  case VARIABLE_TYPE_INT:
    local_d = true;
    break;
  case VARIABLE_TYPE_UINT:
    local_d = true;
  }
  return local_d;
}

Assistant:

bool Utils::isScalarVariableType(_variable_type type)
{
	bool result = false;

	switch (type)
	{
	case VARIABLE_TYPE_BOOL:
		result = true;
		break;
	case VARIABLE_TYPE_DOUBLE:
		result = true;
		break;
	case VARIABLE_TYPE_FLOAT:
		result = true;
		break;
	case VARIABLE_TYPE_INT:
		result = true;
		break;
	case VARIABLE_TYPE_UINT:
		result = true;
		break;
	default:
		break;
	}; /* switch (type) */

	return result;
}